

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O1

bool __thiscall
chrono::fea::ChPlasticityCosseratLumped::ComputeStressWithReturnMapping
          (ChPlasticityCosseratLumped *this,ChVector<double> *stress_n,ChVector<double> *stress_m,
          ChVector<double> *e_strain_e_new,ChVector<double> *e_strain_k_new,
          ChBeamMaterialInternalData *data_new,ChVector<double> *tot_strain_e,
          ChVector<double> *tot_strain_k,ChBeamMaterialInternalData *data)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ChBeamSectionCosserat *pCVar14;
  element_type *peVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  long lVar35;
  long lVar36;
  ChException *this_00;
  int iVar37;
  undefined1 auVar38 [16];
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined8 in_XMM3_Qb;
  string local_50;
  
  lVar35 = __dynamic_cast(data,&ChBeamMaterialInternalData::typeinfo,
                          &ChInternalDataLumpedCosserat::typeinfo,0);
  lVar36 = __dynamic_cast(data_new,&ChBeamMaterialInternalData::typeinfo,
                          &ChInternalDataLumpedCosserat::typeinfo,0);
  if (lVar35 != 0) {
    dVar39 = tot_strain_e->m_data[2];
    dVar1 = *(double *)(lVar35 + 0x50);
    dVar40 = tot_strain_e->m_data[1];
    dVar42 = *(double *)(lVar35 + 0x48);
    e_strain_e_new->m_data[0] = tot_strain_e->m_data[0] - *(double *)(lVar35 + 0x40);
    e_strain_e_new->m_data[1] = dVar40 - dVar42;
    e_strain_e_new->m_data[2] = dVar39 - dVar1;
    dVar39 = tot_strain_k->m_data[2];
    dVar1 = *(double *)(lVar35 + 0x68);
    dVar40 = tot_strain_k->m_data[1];
    dVar42 = *(double *)(lVar35 + 0x60);
    e_strain_k_new->m_data[0] = tot_strain_k->m_data[0] - *(double *)(lVar35 + 0x58);
    e_strain_k_new->m_data[1] = dVar40 - dVar42;
    e_strain_k_new->m_data[2] = dVar39 - dVar1;
    pCVar14 = (this->super_ChPlasticityCosserat).section;
    peVar15 = (pCVar14->elasticity).
              super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    p_Var16 = (pCVar14->elasticity).
              super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
      }
    }
    (*peVar15->_vptr_ChElasticityCosserat[2])
              (peVar15,stress_n,stress_m,e_strain_e_new,e_strain_k_new);
    if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
    }
    dVar39 = *(double *)(lVar35 + 0x10);
    (*((this->n_yeld_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    dVar1 = stress_n->m_data[0];
    dVar40 = *(double *)(lVar35 + 0x40);
    (*((this->n_beta_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    auVar38._8_8_ = 0x7fffffffffffffff;
    auVar38._0_8_ = 0x7fffffffffffffff;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = dVar1 - dVar40;
    auVar38 = vandpd_avx512vl(auVar43,auVar38);
    dVar39 = auVar38._0_8_ - dVar39;
    if (0.0 < dVar39) {
      *(undefined8 *)(lVar36 + 0x10) = *(undefined8 *)(lVar35 + 0x10);
      *(undefined8 *)(lVar36 + 0x40) = *(undefined8 *)(lVar35 + 0x40);
      if (((this->super_ChPlasticityCosserat).nr_yeld_tolerance < dVar39) &&
         (0 < (this->super_ChPlasticityCosserat).nr_yeld_maxiters)) {
        iVar37 = 1;
        dVar1 = 0.0;
        do {
          dVar40 = *(double *)(lVar35 + 0x40);
          auVar61._8_8_ = 0;
          auVar61._0_8_ = stress_n->m_data[0];
          auVar18._8_8_ = 0x8000000000000000;
          auVar18._0_8_ = 0x8000000000000000;
          auVar38 = vxorpd_avx512vl(auVar61,auVar18);
          dVar42 = e_strain_e_new->m_data[0];
          (*((this->n_beta_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[5])();
          dVar41 = *(double *)(lVar35 + 0x10);
          (*((this->n_yeld_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[5])();
          dVar40 = dVar1 - dVar39 / (auVar38._0_8_ / dVar42 - (dVar41 + dVar40));
          dVar1 = dVar40 - dVar1;
          *(double *)(lVar36 + 0x10) = dVar1 + *(double *)(lVar36 + 0x10);
          auVar62._0_8_ =
               (double)(int)((uint)(0.0 < stress_n->m_data[0]) - (uint)(stress_n->m_data[0] < 0.0));
          auVar62._8_8_ = in_XMM3_Qb;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = e_strain_e_new->m_data[0];
          auVar44._8_8_ = 0;
          auVar44._0_8_ = dVar1;
          auVar38 = vfnmadd213sd_fma(auVar62,auVar44,auVar2);
          e_strain_e_new->m_data[0] = auVar38._0_8_;
          auVar63._0_8_ =
               (double)(int)((uint)(0.0 < stress_n->m_data[0]) - (uint)(stress_n->m_data[0] < 0.0));
          auVar63._8_8_ = in_XMM3_Qb;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(lVar36 + 0x40);
          auVar38 = vfmadd213sd_fma(auVar63,auVar44,auVar3);
          *(long *)(lVar36 + 0x40) = auVar38._0_8_;
          pCVar14 = (this->super_ChPlasticityCosserat).section;
          peVar15 = (pCVar14->elasticity).
                    super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          p_Var16 = (pCVar14->elasticity).
                    super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            }
          }
          (*peVar15->_vptr_ChElasticityCosserat[2])
                    (peVar15,stress_n,stress_m,e_strain_e_new,e_strain_k_new);
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
          }
          dVar39 = *(double *)(lVar36 + 0x10);
          (*((this->n_yeld_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[4])();
          dVar1 = stress_n->m_data[0];
          dVar42 = *(double *)(lVar36 + 0x40);
          (*((this->n_beta_x).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[4])();
          auVar19._8_8_ = 0x7fffffffffffffff;
          auVar19._0_8_ = 0x7fffffffffffffff;
          auVar45._8_8_ = 0;
          auVar45._0_8_ = dVar1 - dVar42;
          auVar38 = vandpd_avx512vl(auVar45,auVar19);
          dVar39 = auVar38._0_8_ - dVar39;
        } while (((this->super_ChPlasticityCosserat).nr_yeld_tolerance < dVar39) &&
                (bVar17 = iVar37 < (this->super_ChPlasticityCosserat).nr_yeld_maxiters,
                iVar37 = iVar37 + 1, dVar1 = dVar40, bVar17));
      }
    }
    dVar39 = *(double *)(lVar35 + 0x18);
    (*((this->n_yeld_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    dVar1 = stress_n->m_data[1];
    dVar40 = *(double *)(lVar35 + 0x48);
    (*((this->n_beta_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    auVar20._8_8_ = 0x7fffffffffffffff;
    auVar20._0_8_ = 0x7fffffffffffffff;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = dVar1 - dVar40;
    auVar38 = vandpd_avx512vl(auVar46,auVar20);
    dVar39 = auVar38._0_8_ - dVar39;
    if (dVar39 < 0.0) {
      *(undefined8 *)(lVar36 + 0x18) = *(undefined8 *)(lVar35 + 0x18);
      *(undefined8 *)(lVar36 + 0x48) = *(undefined8 *)(lVar35 + 0x48);
      if (((this->super_ChPlasticityCosserat).nr_yeld_tolerance < dVar39) &&
         (0 < (this->super_ChPlasticityCosserat).nr_yeld_maxiters)) {
        iVar37 = 1;
        dVar1 = 0.0;
        do {
          dVar40 = *(double *)(lVar35 + 0x48);
          auVar64._8_8_ = 0;
          auVar64._0_8_ = stress_n->m_data[1];
          auVar21._8_8_ = 0x8000000000000000;
          auVar21._0_8_ = 0x8000000000000000;
          auVar38 = vxorpd_avx512vl(auVar64,auVar21);
          dVar42 = e_strain_e_new->m_data[1];
          (*((this->n_beta_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[5])();
          dVar41 = *(double *)(lVar35 + 0x18);
          (*((this->n_yeld_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[5])();
          dVar40 = dVar1 - dVar39 / (auVar38._0_8_ / dVar42 - (dVar41 + dVar40));
          dVar1 = dVar40 - dVar1;
          *(double *)(lVar36 + 0x18) = dVar1 + *(double *)(lVar36 + 0x18);
          auVar65._0_8_ =
               (double)(int)((uint)(0.0 < stress_n->m_data[1]) - (uint)(stress_n->m_data[1] < 0.0));
          auVar65._8_8_ = in_XMM3_Qb;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = e_strain_e_new->m_data[1];
          auVar47._8_8_ = 0;
          auVar47._0_8_ = dVar1;
          auVar38 = vfnmadd213sd_fma(auVar65,auVar47,auVar4);
          e_strain_e_new->m_data[1] = auVar38._0_8_;
          auVar66._0_8_ =
               (double)(int)((uint)(0.0 < stress_n->m_data[1]) - (uint)(stress_n->m_data[1] < 0.0));
          auVar66._8_8_ = in_XMM3_Qb;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(lVar36 + 0x48);
          auVar38 = vfmadd213sd_fma(auVar66,auVar47,auVar5);
          *(long *)(lVar36 + 0x48) = auVar38._0_8_;
          pCVar14 = (this->super_ChPlasticityCosserat).section;
          peVar15 = (pCVar14->elasticity).
                    super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          p_Var16 = (pCVar14->elasticity).
                    super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            }
          }
          (*peVar15->_vptr_ChElasticityCosserat[2])
                    (peVar15,stress_n,stress_m,e_strain_e_new,e_strain_k_new);
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
          }
          dVar39 = *(double *)(lVar36 + 0x18);
          (*((this->n_yeld_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[4])();
          dVar1 = stress_n->m_data[1];
          dVar42 = *(double *)(lVar36 + 0x48);
          (*((this->n_beta_y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[4])();
          auVar22._8_8_ = 0x7fffffffffffffff;
          auVar22._0_8_ = 0x7fffffffffffffff;
          auVar48._8_8_ = 0;
          auVar48._0_8_ = dVar1 - dVar42;
          auVar38 = vandpd_avx512vl(auVar48,auVar22);
          dVar39 = auVar38._0_8_ - dVar39;
        } while (((this->super_ChPlasticityCosserat).nr_yeld_tolerance < dVar39) &&
                (bVar17 = iVar37 < (this->super_ChPlasticityCosserat).nr_yeld_maxiters,
                iVar37 = iVar37 + 1, dVar1 = dVar40, bVar17));
      }
    }
    dVar39 = *(double *)(lVar35 + 0x20);
    (*((this->n_yeld_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    dVar1 = stress_n->m_data[2];
    dVar40 = *(double *)(lVar35 + 0x50);
    (*((this->n_beta_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ChFunction[4])();
    auVar23._8_8_ = 0x7fffffffffffffff;
    auVar23._0_8_ = 0x7fffffffffffffff;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = dVar1 - dVar40;
    auVar38 = vandpd_avx512vl(auVar49,auVar23);
    dVar39 = auVar38._0_8_ - dVar39;
    if (0.0 < dVar39) {
      *(undefined8 *)(lVar36 + 0x20) = *(undefined8 *)(lVar35 + 0x20);
      *(undefined8 *)(lVar36 + 0x50) = *(undefined8 *)(lVar35 + 0x50);
      if (((this->super_ChPlasticityCosserat).nr_yeld_tolerance < dVar39) &&
         (0 < (this->super_ChPlasticityCosserat).nr_yeld_maxiters)) {
        iVar37 = 1;
        dVar1 = 0.0;
        do {
          dVar40 = *(double *)(lVar35 + 0x50);
          auVar67._8_8_ = 0;
          auVar67._0_8_ = stress_n->m_data[2];
          auVar24._8_8_ = 0x8000000000000000;
          auVar24._0_8_ = 0x8000000000000000;
          auVar38 = vxorpd_avx512vl(auVar67,auVar24);
          dVar42 = e_strain_e_new->m_data[2];
          (*((this->n_beta_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[5])();
          dVar41 = *(double *)(lVar35 + 0x20);
          (*((this->n_yeld_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[5])();
          dVar40 = dVar1 - dVar39 / (auVar38._0_8_ / dVar42 - (dVar41 + dVar40));
          dVar1 = dVar40 - dVar1;
          *(double *)(lVar36 + 0x20) = dVar1 + *(double *)(lVar36 + 0x20);
          auVar68._0_8_ =
               (double)(int)((uint)(0.0 < stress_n->m_data[2]) - (uint)(stress_n->m_data[2] < 0.0));
          auVar68._8_8_ = in_XMM3_Qb;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = e_strain_e_new->m_data[2];
          auVar50._8_8_ = 0;
          auVar50._0_8_ = dVar1;
          auVar38 = vfnmadd213sd_fma(auVar68,auVar50,auVar6);
          e_strain_e_new->m_data[2] = auVar38._0_8_;
          auVar69._0_8_ =
               (double)(int)((uint)(0.0 < stress_n->m_data[2]) - (uint)(stress_n->m_data[2] < 0.0));
          auVar69._8_8_ = in_XMM3_Qb;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)(lVar36 + 0x50);
          auVar38 = vfmadd213sd_fma(auVar69,auVar50,auVar7);
          *(long *)(lVar36 + 0x50) = auVar38._0_8_;
          pCVar14 = (this->super_ChPlasticityCosserat).section;
          peVar15 = (pCVar14->elasticity).
                    super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          p_Var16 = (pCVar14->elasticity).
                    super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            }
          }
          (*peVar15->_vptr_ChElasticityCosserat[2])
                    (peVar15,stress_n,stress_m,e_strain_e_new,e_strain_k_new);
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
          }
          dVar39 = *(double *)(lVar36 + 0x20);
          (*((this->n_yeld_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[4])();
          dVar1 = stress_n->m_data[2];
          dVar42 = *(double *)(lVar36 + 0x50);
          (*((this->n_beta_z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[4])();
          auVar25._8_8_ = 0x7fffffffffffffff;
          auVar25._0_8_ = 0x7fffffffffffffff;
          auVar51._8_8_ = 0;
          auVar51._0_8_ = dVar1 - dVar42;
          auVar38 = vandpd_avx512vl(auVar51,auVar25);
          dVar39 = auVar38._0_8_ - dVar39;
        } while (((this->super_ChPlasticityCosserat).nr_yeld_tolerance < dVar39) &&
                (bVar17 = iVar37 < (this->super_ChPlasticityCosserat).nr_yeld_maxiters,
                iVar37 = iVar37 + 1, dVar1 = dVar40, bVar17));
      }
    }
    dVar39 = *(double *)(lVar35 + 0x28);
    (*((this->n_yeld_Mx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_ChFunction[4])();
    dVar1 = stress_m->m_data[0];
    dVar40 = *(double *)(lVar35 + 0x58);
    (*((this->n_beta_Mx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_ChFunction[4])();
    auVar26._8_8_ = 0x7fffffffffffffff;
    auVar26._0_8_ = 0x7fffffffffffffff;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar1 - dVar40;
    auVar38 = vandpd_avx512vl(auVar52,auVar26);
    dVar39 = auVar38._0_8_ - dVar39;
    if (0.0 < dVar39) {
      *(undefined8 *)(lVar36 + 0x28) = *(undefined8 *)(lVar35 + 0x28);
      *(undefined8 *)(lVar36 + 0x58) = *(undefined8 *)(lVar35 + 0x58);
      if (((this->super_ChPlasticityCosserat).nr_yeld_tolerance < dVar39) &&
         (0 < (this->super_ChPlasticityCosserat).nr_yeld_maxiters)) {
        iVar37 = 1;
        dVar1 = 0.0;
        do {
          dVar40 = *(double *)(lVar35 + 0x58);
          auVar70._8_8_ = 0;
          auVar70._0_8_ = stress_m->m_data[0];
          auVar27._8_8_ = 0x8000000000000000;
          auVar27._0_8_ = 0x8000000000000000;
          auVar38 = vxorpd_avx512vl(auVar70,auVar27);
          dVar42 = e_strain_k_new->m_data[0];
          (*((this->n_beta_Mx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[5])();
          dVar41 = *(double *)(lVar35 + 0x28);
          (*((this->n_yeld_Mx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[5])();
          dVar40 = dVar1 - dVar39 / (auVar38._0_8_ / dVar42 - (dVar41 + dVar40));
          dVar1 = dVar40 - dVar1;
          *(double *)(lVar36 + 0x28) = dVar1 + *(double *)(lVar36 + 0x28);
          auVar71._0_8_ =
               (double)(int)((uint)(0.0 < stress_m->m_data[0]) - (uint)(stress_m->m_data[0] < 0.0));
          auVar71._8_8_ = in_XMM3_Qb;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = e_strain_k_new->m_data[0];
          auVar53._8_8_ = 0;
          auVar53._0_8_ = dVar1;
          auVar38 = vfnmadd213sd_fma(auVar71,auVar53,auVar8);
          e_strain_k_new->m_data[0] = auVar38._0_8_;
          auVar72._0_8_ =
               (double)(int)((uint)(0.0 < stress_m->m_data[0]) - (uint)(stress_m->m_data[0] < 0.0));
          auVar72._8_8_ = in_XMM3_Qb;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)(lVar36 + 0x58);
          auVar38 = vfmadd213sd_fma(auVar72,auVar53,auVar9);
          *(long *)(lVar36 + 0x58) = auVar38._0_8_;
          pCVar14 = (this->super_ChPlasticityCosserat).section;
          peVar15 = (pCVar14->elasticity).
                    super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          p_Var16 = (pCVar14->elasticity).
                    super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            }
          }
          (*peVar15->_vptr_ChElasticityCosserat[2])
                    (peVar15,stress_n,stress_m,e_strain_e_new,e_strain_k_new);
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
          }
          dVar39 = *(double *)(lVar36 + 0x28);
          (*((this->n_yeld_Mx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[4])();
          dVar1 = stress_m->m_data[0];
          dVar42 = *(double *)(lVar36 + 0x58);
          (*((this->n_beta_Mx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[4])();
          auVar28._8_8_ = 0x7fffffffffffffff;
          auVar28._0_8_ = 0x7fffffffffffffff;
          auVar54._8_8_ = 0;
          auVar54._0_8_ = dVar1 - dVar42;
          auVar38 = vandpd_avx512vl(auVar54,auVar28);
          dVar39 = auVar38._0_8_ - dVar39;
        } while (((this->super_ChPlasticityCosserat).nr_yeld_tolerance < dVar39) &&
                (bVar17 = iVar37 < (this->super_ChPlasticityCosserat).nr_yeld_maxiters,
                iVar37 = iVar37 + 1, dVar1 = dVar40, bVar17));
      }
    }
    dVar39 = *(double *)(lVar35 + 0x30);
    (*((this->n_yeld_My).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_ChFunction[4])();
    dVar1 = stress_m->m_data[1];
    dVar40 = *(double *)(lVar35 + 0x60);
    (*((this->n_beta_My).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_ChFunction[4])();
    auVar29._8_8_ = 0x7fffffffffffffff;
    auVar29._0_8_ = 0x7fffffffffffffff;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar1 - dVar40;
    auVar38 = vandpd_avx512vl(auVar55,auVar29);
    dVar39 = auVar38._0_8_ - dVar39;
    if (0.0 < dVar39) {
      *(undefined8 *)(lVar36 + 0x30) = *(undefined8 *)(lVar35 + 0x30);
      *(undefined8 *)(lVar36 + 0x60) = *(undefined8 *)(lVar35 + 0x60);
      if (((this->super_ChPlasticityCosserat).nr_yeld_tolerance < dVar39) &&
         (0 < (this->super_ChPlasticityCosserat).nr_yeld_maxiters)) {
        iVar37 = 1;
        dVar1 = 0.0;
        do {
          dVar40 = *(double *)(lVar35 + 0x60);
          auVar73._8_8_ = 0;
          auVar73._0_8_ = stress_m->m_data[1];
          auVar30._8_8_ = 0x8000000000000000;
          auVar30._0_8_ = 0x8000000000000000;
          auVar38 = vxorpd_avx512vl(auVar73,auVar30);
          dVar42 = e_strain_k_new->m_data[1];
          (*((this->n_beta_My).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[5])();
          dVar41 = *(double *)(lVar35 + 0x30);
          (*((this->n_yeld_My).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[5])();
          dVar40 = dVar1 - dVar39 / (auVar38._0_8_ / dVar42 - (dVar41 + dVar40));
          dVar1 = dVar40 - dVar1;
          *(double *)(lVar36 + 0x30) = dVar1 + *(double *)(lVar36 + 0x30);
          auVar74._0_8_ =
               (double)(int)((uint)(0.0 < stress_m->m_data[1]) - (uint)(stress_m->m_data[1] < 0.0));
          auVar74._8_8_ = in_XMM3_Qb;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = e_strain_k_new->m_data[1];
          auVar56._8_8_ = 0;
          auVar56._0_8_ = dVar1;
          auVar38 = vfnmadd213sd_fma(auVar74,auVar56,auVar10);
          e_strain_k_new->m_data[1] = auVar38._0_8_;
          auVar75._0_8_ =
               (double)(int)((uint)(0.0 < stress_m->m_data[1]) - (uint)(stress_m->m_data[1] < 0.0));
          auVar75._8_8_ = in_XMM3_Qb;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *(ulong *)(lVar36 + 0x60);
          auVar38 = vfmadd213sd_fma(auVar75,auVar56,auVar11);
          *(long *)(lVar36 + 0x60) = auVar38._0_8_;
          pCVar14 = (this->super_ChPlasticityCosserat).section;
          peVar15 = (pCVar14->elasticity).
                    super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          p_Var16 = (pCVar14->elasticity).
                    super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            }
          }
          (*peVar15->_vptr_ChElasticityCosserat[2])
                    (peVar15,stress_n,stress_m,e_strain_e_new,e_strain_k_new);
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
          }
          dVar39 = *(double *)(lVar36 + 0x30);
          (*((this->n_yeld_My).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[4])();
          dVar1 = stress_m->m_data[1];
          dVar42 = *(double *)(lVar36 + 0x60);
          (*((this->n_beta_My).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[4])();
          auVar31._8_8_ = 0x7fffffffffffffff;
          auVar31._0_8_ = 0x7fffffffffffffff;
          auVar57._8_8_ = 0;
          auVar57._0_8_ = dVar1 - dVar42;
          auVar38 = vandpd_avx512vl(auVar57,auVar31);
          dVar39 = auVar38._0_8_ - dVar39;
        } while (((this->super_ChPlasticityCosserat).nr_yeld_tolerance < dVar39) &&
                (bVar17 = iVar37 < (this->super_ChPlasticityCosserat).nr_yeld_maxiters,
                iVar37 = iVar37 + 1, dVar1 = dVar40, bVar17));
      }
    }
    dVar39 = *(double *)(lVar35 + 0x38);
    (*((this->n_yeld_Mz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_ChFunction[4])();
    dVar1 = stress_m->m_data[2];
    dVar40 = *(double *)(lVar35 + 0x68);
    (*((this->n_beta_Mz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->_vptr_ChFunction[4])();
    auVar32._8_8_ = 0x7fffffffffffffff;
    auVar32._0_8_ = 0x7fffffffffffffff;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = dVar1 - dVar40;
    auVar38 = vandpd_avx512vl(auVar58,auVar32);
    dVar39 = auVar38._0_8_ - dVar39;
    if (0.0 < dVar39) {
      *(undefined8 *)(lVar36 + 0x38) = *(undefined8 *)(lVar35 + 0x38);
      *(undefined8 *)(lVar36 + 0x68) = *(undefined8 *)(lVar35 + 0x68);
      if (((this->super_ChPlasticityCosserat).nr_yeld_tolerance < dVar39) &&
         (0 < (this->super_ChPlasticityCosserat).nr_yeld_maxiters)) {
        iVar37 = 1;
        dVar1 = 0.0;
        do {
          dVar40 = *(double *)(lVar35 + 0x68);
          auVar76._8_8_ = 0;
          auVar76._0_8_ = stress_m->m_data[2];
          auVar33._8_8_ = 0x8000000000000000;
          auVar33._0_8_ = 0x8000000000000000;
          auVar38 = vxorpd_avx512vl(auVar76,auVar33);
          dVar42 = e_strain_k_new->m_data[2];
          (*((this->n_beta_Mz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[5])();
          dVar41 = *(double *)(lVar35 + 0x38);
          (*((this->n_yeld_Mz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[5])();
          dVar40 = dVar1 - dVar39 / (auVar38._0_8_ / dVar42 - (dVar41 + dVar40));
          dVar1 = dVar40 - dVar1;
          *(double *)(lVar36 + 0x38) = dVar1 + *(double *)(lVar36 + 0x38);
          auVar77._0_8_ =
               (double)(int)((uint)(0.0 < stress_m->m_data[2]) - (uint)(stress_m->m_data[2] < 0.0));
          auVar77._8_8_ = in_XMM3_Qb;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = e_strain_k_new->m_data[2];
          auVar59._8_8_ = 0;
          auVar59._0_8_ = dVar1;
          auVar38 = vfnmadd213sd_fma(auVar77,auVar59,auVar12);
          e_strain_k_new->m_data[2] = auVar38._0_8_;
          auVar78._0_8_ =
               (double)(int)((uint)(0.0 < stress_m->m_data[2]) - (uint)(stress_m->m_data[2] < 0.0));
          auVar78._8_8_ = in_XMM3_Qb;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = *(ulong *)(lVar36 + 0x68);
          auVar38 = vfmadd213sd_fma(auVar78,auVar59,auVar13);
          *(long *)(lVar36 + 0x68) = auVar38._0_8_;
          pCVar14 = (this->super_ChPlasticityCosserat).section;
          peVar15 = (pCVar14->elasticity).
                    super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          p_Var16 = (pCVar14->elasticity).
                    super___shared_ptr<chrono::fea::ChElasticityCosserat,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            }
          }
          (*peVar15->_vptr_ChElasticityCosserat[2])
                    (peVar15,stress_n,stress_m,e_strain_e_new,e_strain_k_new);
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
          }
          dVar39 = *(double *)(lVar36 + 0x38);
          (*((this->n_yeld_Mz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[4])();
          dVar1 = stress_m->m_data[2];
          dVar42 = *(double *)(lVar36 + 0x68);
          (*((this->n_beta_Mz).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[4])();
          auVar34._8_8_ = 0x7fffffffffffffff;
          auVar34._0_8_ = 0x7fffffffffffffff;
          auVar60._8_8_ = 0;
          auVar60._0_8_ = dVar1 - dVar42;
          auVar38 = vandpd_avx512vl(auVar60,auVar34);
          dVar39 = auVar38._0_8_ - dVar39;
        } while (((this->super_ChPlasticityCosserat).nr_yeld_tolerance < dVar39) &&
                (bVar17 = iVar37 < (this->super_ChPlasticityCosserat).nr_yeld_maxiters,
                iVar37 = iVar37 + 1, dVar1 = dVar40, bVar17));
      }
    }
    *(double *)(lVar36 + 8) =
         *(double *)(lVar36 + 0x10) + *(double *)(lVar36 + 0x18) + *(double *)(lVar36 + 0x20) +
         *(double *)(lVar36 + 0x28) + *(double *)(lVar36 + 0x30) + *(double *)(lVar36 + 0x38);
    return true;
  }
  this_00 = (ChException *)__cxa_allocate_exception(0x28);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "ComputeStressWithReturnMapping cannot cast data to ChInternalDataLumpedCosserat*.","")
  ;
  ChException::ChException(this_00,&local_50);
  __cxa_throw(this_00,&ChException::typeinfo,ChException::~ChException);
}

Assistant:

bool ChPlasticityCosseratLumped::ComputeStressWithReturnMapping(ChVector<>& stress_n,
                                                                ChVector<>& stress_m,
                                                                ChVector<>& e_strain_e_new,
                                                                ChVector<>& e_strain_k_new,
                                                                ChBeamMaterialInternalData& data_new,
                                                                const ChVector<>& tot_strain_e,
                                                                const ChVector<>& tot_strain_k,
                                                                const ChBeamMaterialInternalData& data) {
    auto mydata = dynamic_cast<const ChInternalDataLumpedCosserat*>(&data);
    auto mydata_new = dynamic_cast<ChInternalDataLumpedCosserat*>(&data_new);

    if (!mydata)
        throw ChException("ComputeStressWithReturnMapping cannot cast data to ChInternalDataLumpedCosserat*.");

    // Implement return mapping for a simple 1D plasticity model.

    // Compute the elastic trial stress:
    e_strain_e_new = tot_strain_e - mydata->p_strain_e;
    e_strain_k_new = tot_strain_k - mydata->p_strain_k;
    // double p_strain_acc = mydata->p_strain_acc;
    this->section->GetElasticity()->ComputeStress(stress_n, stress_m, e_strain_e_new, e_strain_k_new);

    // axial direction
    {
        double strain_yeld_x = this->n_yeld_x->Get_y(mydata->p_strain_acc_e.x());     //<<<< sigma_y(p_strain_acc)
        double eta_x = stress_n.x() - this->n_beta_x->Get_y(mydata->p_strain_e.x());  //<<<< beta(p_strain_e)
        double Fyeld_x = fabs(eta_x) - strain_yeld_x;                                 //<<<<  Phi(sigma,p_strain_acc)

        if (Fyeld_x > 0) {
            double Dgamma = 0;
            double Dgamma_old = 0;
            mydata_new->p_strain_acc_e.x() = mydata->p_strain_acc_e.x();
            mydata_new->p_strain_e.x() = mydata->p_strain_e.x();
            int iters = 0;
            while ((Fyeld_x > this->nr_yeld_tolerance) && (iters < this->nr_yeld_maxiters)) {
                double E_x = stress_n.x() / e_strain_e_new.x();  // instead of costly evaluation of Km, =dstress/dstrain
                double H = this->n_beta_x->Get_y_dx(mydata->p_strain_e.x()) +
                           this->n_yeld_x->Get_y_dx(mydata->p_strain_acc_e.x());  //<<<<  H = dyeld/dplasticflow
                Dgamma -= Fyeld_x / (-E_x - H);
                double dDgamma = Dgamma - Dgamma_old;
                Dgamma_old = Dgamma;
                mydata_new->p_strain_acc_e.x() += dDgamma;
                e_strain_e_new.x() -= dDgamma * chrono::ChSignum(stress_n.x());
                mydata_new->p_strain_e.x() += dDgamma * chrono::ChSignum(stress_n.x());
                this->section->GetElasticity()->ComputeStress(stress_n, stress_m, e_strain_e_new, e_strain_k_new);
                // compute yeld
                strain_yeld_x = this->n_yeld_x->Get_y(mydata_new->p_strain_acc_e.x());     //<<<< sigma_y(p_strain_acc)
                eta_x = stress_n.x() - this->n_beta_x->Get_y(mydata_new->p_strain_e.x());  //<<<< beta(p_strain_acc)
                Fyeld_x = fabs(eta_x) - strain_yeld_x;  //<<<<  Phi(sigma,p_strain_acc)

                ++iters;
            }
        }
    }

    // shear direction
    {
        double strain_yeld_y = this->n_yeld_y->Get_y(mydata->p_strain_acc_e.y());
        double eta_y = stress_n.y() - this->n_beta_y->Get_y(mydata->p_strain_e.y());
        double Fyeld_y = fabs(eta_y) - strain_yeld_y;  //<<<<  Phi(sigma,p_strain_acc)

        if (Fyeld_y < 0) {
            double Dgamma = 0;
            double Dgamma_old = 0;
            mydata_new->p_strain_acc_e.y() = mydata->p_strain_acc_e.y();
            mydata_new->p_strain_e.y() = mydata->p_strain_e.y();
            int iters = 0;
            while ((Fyeld_y > this->nr_yeld_tolerance) && (iters < this->nr_yeld_maxiters)) {
                double E_y = stress_n.y() / e_strain_e_new.y();  // instead of costly evaluation of Km, =dstress/dstrain
                double H = this->n_beta_y->Get_y_dx(mydata->p_strain_e.y()) +
                           this->n_yeld_y->Get_y_dx(mydata->p_strain_acc_e.y());  //<<<<  H = dyeld/dplasticflow
                Dgamma -= Fyeld_y / (-E_y - H);
                double dDgamma = Dgamma - Dgamma_old;
                Dgamma_old = Dgamma;
                mydata_new->p_strain_acc_e.y() += dDgamma;
                e_strain_e_new.y() -= dDgamma * chrono::ChSignum(stress_n.y());
                mydata_new->p_strain_e.y() += dDgamma * chrono::ChSignum(stress_n.y());
                this->section->GetElasticity()->ComputeStress(stress_n, stress_m, e_strain_e_new, e_strain_k_new);
                // compute yeld
                strain_yeld_y = this->n_yeld_y->Get_y(mydata_new->p_strain_acc_e.y());     //<<<< sigma_y(p_strain_acc)
                eta_y = stress_n.y() - this->n_beta_y->Get_y(mydata_new->p_strain_e.y());  //<<<< beta(p_strain_acc)
                Fyeld_y = fabs(eta_y) - strain_yeld_y;  //<<<<  Phi(sigma,p_strain_acc)

                ++iters;
            }
        }
    }

    // shear direction
    {
        double strain_yeld_z = this->n_yeld_z->Get_y(mydata->p_strain_acc_e.z());
        double eta_z = stress_n.z() - this->n_beta_z->Get_y(mydata->p_strain_e.z());
        double Fyeld_z = fabs(eta_z) - strain_yeld_z;  //<<<<  Phi(sigma,p_strain_acc)

        if (Fyeld_z > 0) {
            double Dgamma = 0;
            double Dgamma_old = 0;
            mydata_new->p_strain_acc_e.z() = mydata->p_strain_acc_e.z();
            mydata_new->p_strain_e.z() = mydata->p_strain_e.z();
            int iters = 0;
            while ((Fyeld_z > this->nr_yeld_tolerance) && (iters < this->nr_yeld_maxiters)) {
                double E_z = stress_n.z() / e_strain_e_new.z();  // instead of costly evaluation of Km, =dstress/dstrain
                double H = this->n_beta_z->Get_y_dx(mydata->p_strain_e.z()) +
                           this->n_yeld_z->Get_y_dx(mydata->p_strain_acc_e.z());  //<<<<  H = dyeld/dplasticflow
                Dgamma -= Fyeld_z / (-E_z - H);
                double dDgamma = Dgamma - Dgamma_old;
                Dgamma_old = Dgamma;
                mydata_new->p_strain_acc_e.z() += dDgamma;
                e_strain_e_new.z() -= dDgamma * chrono::ChSignum(stress_n.z());
                mydata_new->p_strain_e.z() += dDgamma * chrono::ChSignum(stress_n.z());
                this->section->GetElasticity()->ComputeStress(stress_n, stress_m, e_strain_e_new, e_strain_k_new);
                // compute yeld
                strain_yeld_z = this->n_yeld_z->Get_y(mydata_new->p_strain_acc_e.z());     //<<<< sigma_y(p_strain_acc)
                eta_z = stress_n.z() - this->n_beta_z->Get_y(mydata_new->p_strain_e.z());  //<<<< beta(p_strain_acc)
                Fyeld_z = fabs(eta_z) - strain_yeld_z;  //<<<<  Phi(sigma,p_strain_acc)

                ++iters;
            }
        }
    }

    // torsion direction
    {
        double strain_yeld_Mx = this->n_yeld_Mx->Get_y(mydata->p_strain_acc_k.x());
        double eta_Mx = stress_m.x() - this->n_beta_Mx->Get_y(mydata->p_strain_k.x());
        double Fyeld_Mx = fabs(eta_Mx) - strain_yeld_Mx;

        if (Fyeld_Mx > 0) {
            double Dgamma = 0;
            double Dgamma_old = 0;
            mydata_new->p_strain_acc_k.x() = mydata->p_strain_acc_k.x();
            mydata_new->p_strain_k.x() = mydata->p_strain_k.x();
            int iters = 0;
            while ((Fyeld_Mx > this->nr_yeld_tolerance) && (iters < this->nr_yeld_maxiters)) {
                double E_Mx = stress_m.x() / e_strain_k_new.x();  // instead of costly evaluation of Km,
                                                                  // =dstress/dstrain
                double H = this->n_beta_Mx->Get_y_dx(mydata->p_strain_k.x()) +
                           this->n_yeld_Mx->Get_y_dx(mydata->p_strain_acc_k.x());  //<<<<  H = dyeld/dplasticflow
                Dgamma -= Fyeld_Mx / (-E_Mx - H);
                double dDgamma = Dgamma - Dgamma_old;
                Dgamma_old = Dgamma;
                mydata_new->p_strain_acc_k.x() += dDgamma;
                e_strain_k_new.x() -= dDgamma * chrono::ChSignum(stress_m.x());
                mydata_new->p_strain_k.x() += dDgamma * chrono::ChSignum(stress_m.x());
                this->section->GetElasticity()->ComputeStress(stress_n, stress_m, e_strain_e_new, e_strain_k_new);
                // compute yeld
                strain_yeld_Mx = this->n_yeld_Mx->Get_y(mydata_new->p_strain_acc_k.x());  //<<<< sigma_y(p_strain_acc)
                eta_Mx = stress_m.x() - this->n_beta_Mx->Get_y(mydata_new->p_strain_k.x());  //<<<< beta(p_strain_acc)
                Fyeld_Mx = fabs(eta_Mx) - strain_yeld_Mx;  //<<<<  Phi(sigma,p_strain_acc)

                ++iters;
            }
        }
    }

    // bending y direction
    {
        double strain_yeld_My = this->n_yeld_My->Get_y(mydata->p_strain_acc_k.y());
        double eta_My = stress_m.y() - this->n_beta_My->Get_y(mydata->p_strain_k.y());
        double Fyeld_My = fabs(eta_My) - strain_yeld_My;

        if (Fyeld_My > 0) {
            double Dgamma = 0;
            double Dgamma_old = 0;
            mydata_new->p_strain_acc_k.y() = mydata->p_strain_acc_k.y();
            mydata_new->p_strain_k.y() = mydata->p_strain_k.y();
            int iters = 0;
            while ((Fyeld_My > this->nr_yeld_tolerance) && (iters < this->nr_yeld_maxiters)) {
                double E_My = stress_m.y() / e_strain_k_new.y();  // instead of costly evaluation of Km,
                                                                  // =dstress/dstrain
                double H = this->n_beta_My->Get_y_dx(mydata->p_strain_k.y()) +
                           this->n_yeld_My->Get_y_dx(mydata->p_strain_acc_k.y());  //<<<<  H = dyeld/dplasticflow
                Dgamma -= Fyeld_My / (-E_My - H);
                double dDgamma = Dgamma - Dgamma_old;
                Dgamma_old = Dgamma;
                mydata_new->p_strain_acc_k.y() += dDgamma;
                e_strain_k_new.y() -= dDgamma * chrono::ChSignum(stress_m.y());
                mydata_new->p_strain_k.y() += dDgamma * chrono::ChSignum(stress_m.y());
                this->section->GetElasticity()->ComputeStress(stress_n, stress_m, e_strain_e_new, e_strain_k_new);
                // compute yeld
                strain_yeld_My = this->n_yeld_My->Get_y(mydata_new->p_strain_acc_k.y());  //<<<< sigma_y(p_strain_acc)
                eta_My = stress_m.y() - this->n_beta_My->Get_y(mydata_new->p_strain_k.y());  //<<<< beta(p_strain_acc)
                Fyeld_My = fabs(eta_My) - strain_yeld_My;  //<<<<  Phi(sigma,p_strain_acc)

                ++iters;
            }
        }
    }

    // bending z direction
    {
        double strain_yeld_Mz = this->n_yeld_Mz->Get_y(mydata->p_strain_acc_k.z());
        double eta_Mz = stress_m.z() - this->n_beta_Mz->Get_y(mydata->p_strain_k.z());
        double Fyeld_Mz = fabs(eta_Mz) - strain_yeld_Mz;

        if (Fyeld_Mz > 0) {
            double Dgamma = 0;
            double Dgamma_old = 0;
            mydata_new->p_strain_acc_k.z() = mydata->p_strain_acc_k.z();
            mydata_new->p_strain_k.z() = mydata->p_strain_k.z();
            int iters = 0;
            while ((Fyeld_Mz > this->nr_yeld_tolerance) && (iters < this->nr_yeld_maxiters)) {
                double E_Mz = stress_m.z() / e_strain_k_new.z();  // instead of costly evaluation of Km,
                                                                  // =dstress/dstrain
                double H = this->n_beta_Mz->Get_y_dx(mydata->p_strain_k.z()) +
                           this->n_yeld_Mz->Get_y_dx(mydata->p_strain_acc_k.z());  //<<<<  H = dyeld/dplasticflow
                Dgamma -= Fyeld_Mz / (-E_Mz - H);
                double dDgamma = Dgamma - Dgamma_old;
                Dgamma_old = Dgamma;
                mydata_new->p_strain_acc_k.z() += dDgamma;
                e_strain_k_new.z() -= dDgamma * chrono::ChSignum(stress_m.z());
                mydata_new->p_strain_k.z() += dDgamma * chrono::ChSignum(stress_m.z());
                this->section->GetElasticity()->ComputeStress(stress_n, stress_m, e_strain_e_new, e_strain_k_new);
                // compute yeld
                strain_yeld_Mz = this->n_yeld_Mz->Get_y(mydata_new->p_strain_acc_k.z());  //<<<< sigma_y(p_strain_acc)
                eta_Mz = stress_m.z() - this->n_beta_Mz->Get_y(mydata_new->p_strain_k.z());  //<<<< beta(p_strain_acc)
                Fyeld_Mz = fabs(eta_Mz) - strain_yeld_Mz;  //<<<<  Phi(sigma,p_strain_acc)

                ++iters;
            }
        }
    }
    // te scalar plastic accumulator in this case is the sum of the single accumulators of the various degreees of
    // freedom of the beam:
    mydata_new->p_strain_acc = mydata_new->p_strain_acc_e.x() + mydata_new->p_strain_acc_e.y() +
                               mydata_new->p_strain_acc_e.z() + mydata_new->p_strain_acc_k.x() +
                               mydata_new->p_strain_acc_k.y() + mydata_new->p_strain_acc_k.z();

    return true;
}